

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

string * __thiscall
llvm::yaml::escape_abi_cxx11_
          (string *__return_storage_ptr__,yaml *this,StringRef Input,bool EscapePrintable)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  yaml yVar3;
  pointer pcVar4;
  char cVar5;
  bool bVar6;
  ulong uVar7;
  long *plVar8;
  UTF8Decoded UVar9;
  undefined8 uVar10;
  undefined8 extraout_RAX;
  uint uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  char *__lhs;
  char cVar13;
  yaml *pyVar14;
  StringRef Range;
  string HexStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined4 local_3c;
  ulong local_38;
  
  local_3c = (undefined4)Input.Length;
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (Input.Data == (char *)0x0) {
    return __return_storage_ptr__;
  }
  pyVar14 = (yaml *)(Input.Data + (long)this);
  local_38 = 0;
  do {
    yVar3 = *this;
    if (0x1a < (byte)yVar3) {
      if (((yVar3 != (yaml)0x1b) && (yVar3 != (yaml)0x22)) && (yVar3 != (yaml)0x5c))
      goto switchD_001ab665_caseD_1;
      goto LAB_001ab6fb;
    }
    switch(yVar3) {
    case (yaml)0x0:
      break;
    default:
switchD_001ab665_caseD_1:
      if ((byte)yVar3 < 0x20) {
        uVar7 = (ulong)(char)*this;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_c8.field_2._M_local_buf + 1);
        if (uVar7 == 0) {
          local_c8.field_2._M_local_buf[0] = 0x30;
          paVar12 = &local_c8.field_2;
        }
        if (*this != (yaml)0x0) {
          do {
            uVar11 = (uint)uVar7 & 0xf;
            cVar5 = (char)uVar11;
            cVar13 = cVar5 + '7';
            if (uVar11 < 10) {
              cVar13 = cVar5 + '0';
            }
            *(char *)((long)paVar12 + -1) = cVar13;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar12 + -1);
            bVar6 = 0xf < uVar7;
            uVar7 = uVar7 >> 4;
          } while (bVar6);
        }
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,paVar12,(undefined1 *)((long)&local_c8.field_2 + 1));
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_a0,'\x02' - (char)local_80._M_string_length);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1fecb3);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        psVar2 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_60.field_2._M_allocated_capacity = *psVar2;
          local_60.field_2._8_8_ = plVar8[3];
        }
        else {
          local_60.field_2._M_allocated_capacity = *psVar2;
          local_60._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_60._M_string_length = plVar8[1];
        *plVar8 = (long)psVar2;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_60,(ulong)local_80._M_dataplus._M_p);
        psVar2 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_c8.field_2._M_allocated_capacity = *psVar2;
          local_c8.field_2._8_8_ = plVar8[3];
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar2;
          local_c8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_c8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar2;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      else if ((char)yVar3 < '\0') {
        Range.Length = (long)pyVar14 - (long)this;
        Range.Data = (char *)this;
        UVar9 = decodeUTF8(Range);
        if ((ulong)UVar9 >> 0x20 == 0) {
          local_80._M_string_length = 0x400000000;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          encodeUTF8(0xfffd,(SmallVectorImpl<char> *)&local_80);
          uVar10 = std::__cxx11::string::replace
                             ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length
                              ,(char *)0x0,(ulong)local_80._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            free(local_80._M_dataplus._M_p);
            uVar10 = extraout_RAX;
          }
          local_38 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
        }
        else {
          uVar11 = UVar9.first;
          if ((int)uVar11 < 0x2028) {
            if ((uVar11 != 0x85) && (uVar11 != 0xa0)) goto LAB_001ab9e1;
LAB_001aba1d:
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else {
            if ((uVar11 == 0x2028) || (uVar11 == 0x2029)) goto LAB_001aba1d;
LAB_001ab9e1:
            if (((char)local_3c == '\0') && (bVar6 = sys::unicode::isPrintable(uVar11), bVar6)) {
              std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)this);
            }
            else {
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_c8.field_2._M_local_buf + 1);
              uVar7 = (ulong)UVar9 & 0xffffffff;
              if (uVar7 == 0) {
                local_c8.field_2._M_local_buf[0] = 0x30;
                paVar12 = &local_c8.field_2;
              }
              else {
                do {
                  uVar11 = (uint)uVar7 & 0xf;
                  cVar5 = (char)uVar11;
                  cVar13 = cVar5 + '7';
                  if (uVar11 < 10) {
                    cVar13 = cVar5 + '0';
                  }
                  *(char *)((long)paVar12 + -1) = cVar13;
                  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)paVar12 + -1);
                  bVar6 = 0xf < uVar7;
                  uVar7 = uVar7 >> 4;
                } while (bVar6);
              }
              local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_80,paVar12,(undefined1 *)((long)&local_c8.field_2 + 1));
              cVar5 = (char)local_80._M_string_length;
              if (local_80._M_string_length < 3) {
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                std::__cxx11::string::_M_construct((ulong)&local_a0,'\x02' - cVar5);
                std::operator+(&local_60,"\\x",&local_a0);
                std::operator+(&local_c8,&local_60,&local_80);
                std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
LAB_001abb2b:
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
LAB_001abb38:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_60._M_dataplus._M_p != &local_60.field_2) {
                  operator_delete(local_60._M_dataplus._M_p,
                                  local_60.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p,
                                  local_a0.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                if (local_80._M_string_length < 5) {
                  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_a0,'\x04' - cVar5);
                  __lhs = "\\u";
LAB_001abc08:
                  std::operator+(&local_60,__lhs,&local_a0);
                  std::operator+(&local_c8,&local_60,&local_80);
                  std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) goto LAB_001abb2b;
                  goto LAB_001abb38;
                }
                if (local_80._M_string_length < 9) {
                  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_a0,'\b' - cVar5);
                  __lhs = "\\U";
                  goto LAB_001abc08;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          this = this + (UVar9.second - 1);
        }
        if ((ulong)UVar9 >> 0x20 == 0) {
          if ((local_38 & 1) != 0) {
            return __return_storage_ptr__;
          }
          pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar1) {
            return __return_storage_ptr__;
          }
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
          return __return_storage_ptr__;
        }
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      goto LAB_001ab700;
    case (yaml)0x7:
      break;
    case (yaml)0x8:
      break;
    case (yaml)0x9:
      break;
    case (yaml)0xa:
      break;
    case (yaml)0xb:
      break;
    case (yaml)0xc:
      break;
    case (yaml)0xd:
    }
LAB_001ab6fb:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_001ab700:
    this = this + 1;
    if (this == pyVar14) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string yaml::escape(StringRef Input, bool EscapePrintable) {
  std::string EscapedInput;
  for (StringRef::iterator i = Input.begin(), e = Input.end(); i != e; ++i) {
    if (*i == '\\')
      EscapedInput += "\\\\";
    else if (*i == '"')
      EscapedInput += "\\\"";
    else if (*i == 0)
      EscapedInput += "\\0";
    else if (*i == 0x07)
      EscapedInput += "\\a";
    else if (*i == 0x08)
      EscapedInput += "\\b";
    else if (*i == 0x09)
      EscapedInput += "\\t";
    else if (*i == 0x0A)
      EscapedInput += "\\n";
    else if (*i == 0x0B)
      EscapedInput += "\\v";
    else if (*i == 0x0C)
      EscapedInput += "\\f";
    else if (*i == 0x0D)
      EscapedInput += "\\r";
    else if (*i == 0x1B)
      EscapedInput += "\\e";
    else if ((unsigned char)*i < 0x20) { // Control characters not handled above.
      std::string HexStr = utohexstr(*i);
      EscapedInput += "\\x" + std::string(2 - HexStr.size(), '0') + HexStr;
    } else if (*i & 0x80) { // UTF-8 multiple code unit subsequence.
      UTF8Decoded UnicodeScalarValue
        = decodeUTF8(StringRef(i, Input.end() - i));
      if (UnicodeScalarValue.second == 0) {
        // Found invalid char.
        SmallString<4> Val;
        encodeUTF8(0xFFFD, Val);
        EscapedInput.insert(EscapedInput.end(), Val.begin(), Val.end());
        // FIXME: Error reporting.
        return EscapedInput;
      }
      if (UnicodeScalarValue.first == 0x85)
        EscapedInput += "\\N";
      else if (UnicodeScalarValue.first == 0xA0)
        EscapedInput += "\\_";
      else if (UnicodeScalarValue.first == 0x2028)
        EscapedInput += "\\L";
      else if (UnicodeScalarValue.first == 0x2029)
        EscapedInput += "\\P";
      else if (!EscapePrintable &&
               sys::unicode::isPrintable(UnicodeScalarValue.first))
        EscapedInput += StringRef(i, UnicodeScalarValue.second);
      else {
        std::string HexStr = utohexstr(UnicodeScalarValue.first);
        if (HexStr.size() <= 2)
          EscapedInput += "\\x" + std::string(2 - HexStr.size(), '0') + HexStr;
        else if (HexStr.size() <= 4)
          EscapedInput += "\\u" + std::string(4 - HexStr.size(), '0') + HexStr;
        else if (HexStr.size() <= 8)
          EscapedInput += "\\U" + std::string(8 - HexStr.size(), '0') + HexStr;
      }
      i += UnicodeScalarValue.second - 1;
    } else
      EscapedInput.push_back(*i);
  }
  return EscapedInput;
}